

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O1

internal_node *
pstore::index::details::internal_node::
make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
          (chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *container,
          index_pointer node,internal_node *internal)

{
  reference pvVar1;
  
  if (((ulong)node.internal_ & 2) == 0) {
    pvVar1 = chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>::
             emplace_back<pstore::index::details::internal_node_const&>
                       ((chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul> *
                        )container,internal);
    return pvVar1;
  }
  if (*(long *)((node.internal_ & 0xfffffffffffffffcU)->signature_)._M_elems == 0x6c616e7265746e49)
  {
    return node.internal_ & 0xfffffffffffffffcU;
  }
  assert_failed("inode->signature_ == node_signature_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                ,0x272);
}

Assistant:

bool is_heap () const noexcept {
                    return (reinterpret_cast<std::uintptr_t> (internal_) & heap_node_bit) != 0U;
                }